

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_predicate(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                  lyxp_set *set,int options)

{
  ushort uVar1;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  char *pcVar5;
  LY_ERR *pLVar6;
  void *pvVar7;
  void *pvVar8;
  undefined1 local_98 [8];
  lyxp_set set2;
  uint8_t rep_size;
  uint8_t **pred_repeat;
  uint32_t pred_in_ctx;
  uint32_t orig_size;
  uint32_t orig_pos;
  uint16_t brack2_exp;
  uint16_t orig_exp;
  uint16_t j;
  uint16_t i;
  int ret;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  if ('\x02' < ly_log_level) {
    pcVar4 = "skipped";
    if (set != (lyxp_set *)0x0) {
      pcVar4 = "parsed";
    }
    pcVar5 = print_token(exp->tokens[*exp_idx]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_predicate",pcVar4,pcVar5,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  *exp_idx = *exp_idx + 1;
  if (set == (lyxp_set *)0x0) {
    iVar2 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  else if (set->type == LYXP_SET_NODE_SET) {
    iVar2 = set_sort(set,cur_node,options);
    if (1 < iVar2) {
      pLVar6 = ly_errno_location();
      *pLVar6 = LY_EINT;
      ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).","eval_predicate");
    }
    uVar1 = *exp_idx;
    for (orig_size._0_2_ = uVar1; exp->tokens[(ushort)orig_size] != LYXP_TOKEN_BRACK2;
        orig_size._0_2_ = (ushort)orig_size + 1) {
    }
    pvVar7 = calloc((long)(int)((uint)(ushort)orig_size - (uint)uVar1),8);
    if (pvVar7 == (void *)0x0) {
      pLVar6 = ly_errno_location();
      *pLVar6 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
      return -1;
    }
    for (orig_pos._0_2_ = 0;
        (int)(uint)(ushort)orig_pos < (int)((uint)(ushort)orig_size - (uint)uVar1);
        orig_pos._0_2_ = (ushort)orig_pos + 1) {
      if (exp->repeat[(int)((uint)uVar1 + (uint)(ushort)orig_pos)] != (uint8_t *)0x0) {
        for (set2.ctx_size._3_1_ = 0;
            exp->repeat[(int)((uint)uVar1 + (uint)(ushort)orig_pos)][set2.ctx_size._3_1_] != '\0';
            set2.ctx_size._3_1_ = set2.ctx_size._3_1_ + 1) {
        }
        set2.ctx_size._3_1_ = set2.ctx_size._3_1_ + 1;
        pvVar8 = malloc((ulong)set2.ctx_size._3_1_);
        *(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8) = pvVar8;
        if (*(long *)((long)pvVar7 + (ulong)(ushort)orig_pos * 8) == 0) {
          pLVar6 = ly_errno_location();
          *pLVar6 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
          for (orig_pos._2_2_ = 0; orig_pos._2_2_ < (ushort)orig_pos;
              orig_pos._2_2_ = orig_pos._2_2_ + 1) {
            free(*(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8));
          }
          free(pvVar7);
          return -1;
        }
        memcpy(*(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8),
               exp->repeat[(int)((uint)uVar1 + (uint)(ushort)orig_pos)],(ulong)set2.ctx_size._3_1_);
      }
    }
    uVar3 = set->used;
    orig_pos._2_2_ = 0;
    pred_in_ctx = 1;
    while ((uint)orig_pos._2_2_ < set->used) {
      local_98._0_4_ = LYXP_SET_EMPTY;
      set_insert_node((lyxp_set *)local_98,(set->val).nodes[orig_pos._2_2_].node,
                      (set->val).nodes[orig_pos._2_2_].pos,(set->val).nodes[orig_pos._2_2_].type,0);
      set2.used = pred_in_ctx;
      *exp_idx = uVar1;
      set2.size = uVar3;
      for (orig_pos._0_2_ = 0;
          (int)(uint)(ushort)orig_pos < (int)((uint)(ushort)orig_size - (uint)uVar1);
          orig_pos._0_2_ = (ushort)orig_pos + 1) {
        if (*(long *)((long)pvVar7 + (ulong)(ushort)orig_pos * 8) != 0) {
          for (set2.ctx_size._3_1_ = 0;
              *(char *)(*(long *)((long)pvVar7 + (ulong)(ushort)orig_pos * 8) +
                       (ulong)set2.ctx_size._3_1_) != '\0';
              set2.ctx_size._3_1_ = set2.ctx_size._3_1_ + 1) {
          }
          set2.ctx_size._3_1_ = set2.ctx_size._3_1_ + 1;
          memcpy(exp->repeat[(int)((uint)uVar1 + (uint)(ushort)orig_pos)],
                 *(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8),(ulong)set2.ctx_size._3_1_);
        }
      }
      iVar2 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)local_98,options);
      if (iVar2 != 0) {
        for (orig_pos._0_2_ = 0;
            (int)(uint)(ushort)orig_pos < (int)((uint)(ushort)orig_size - (uint)uVar1);
            orig_pos._0_2_ = (ushort)orig_pos + 1) {
          free(*(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8));
        }
        free(pvVar7);
        lyxp_set_cast((lyxp_set *)local_98,LYXP_SET_EMPTY,cur_node,param_4,options);
        return iVar2;
      }
      if (local_98._0_4_ == LYXP_SET_NUMBER) {
        if ((long)ROUND((longdouble)set2._8_10_) == (ulong)pred_in_ctx) {
          set2._8_10_ = (BADTYPE)1;
        }
        else {
          set2._8_10_ = (BADTYPE)0;
        }
      }
      lyxp_set_cast((lyxp_set *)local_98,LYXP_SET_BOOLEAN,cur_node,param_4,options);
      if (set2._8_4_ == 0) {
        set_remove_node(set,(uint)orig_pos._2_2_);
      }
      else {
        orig_pos._2_2_ = orig_pos._2_2_ + 1;
      }
      pred_in_ctx = pred_in_ctx + 1;
    }
    for (orig_pos._0_2_ = 0;
        (int)(uint)(ushort)orig_pos < (int)((uint)(ushort)orig_size - (uint)uVar1);
        orig_pos._0_2_ = (ushort)orig_pos + 1) {
      free(*(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8));
    }
    free(pvVar7);
  }
  else if (set->type == LYXP_SET_SNODE_SET) {
    uVar1 = *exp_idx;
    for (orig_size._0_2_ = uVar1; exp->tokens[(ushort)orig_size] != LYXP_TOKEN_BRACK2;
        orig_size._0_2_ = (ushort)orig_size + 1) {
    }
    pvVar7 = calloc((long)(int)((uint)(ushort)orig_size - (uint)uVar1),8);
    if (pvVar7 == (void *)0x0) {
      pLVar6 = ly_errno_location();
      *pLVar6 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
      return -1;
    }
    for (orig_pos._0_2_ = 0;
        (int)(uint)(ushort)orig_pos < (int)((uint)(ushort)orig_size - (uint)uVar1);
        orig_pos._0_2_ = (ushort)orig_pos + 1) {
      if (exp->repeat[(int)((uint)uVar1 + (uint)(ushort)orig_pos)] != (uint8_t *)0x0) {
        for (set2.ctx_size._3_1_ = 0;
            exp->repeat[(int)((uint)uVar1 + (uint)(ushort)orig_pos)][set2.ctx_size._3_1_] != '\0';
            set2.ctx_size._3_1_ = set2.ctx_size._3_1_ + 1) {
        }
        set2.ctx_size._3_1_ = set2.ctx_size._3_1_ + 1;
        pvVar8 = malloc((ulong)set2.ctx_size._3_1_);
        *(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8) = pvVar8;
        if (*(long *)((long)pvVar7 + (ulong)(ushort)orig_pos * 8) == 0) {
          pLVar6 = ly_errno_location();
          *pLVar6 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
          for (orig_pos._2_2_ = 0; orig_pos._2_2_ < (ushort)orig_pos;
              orig_pos._2_2_ = orig_pos._2_2_ + 1) {
            free(*(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8));
          }
          free(pvVar7);
          return -1;
        }
        memcpy(*(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8),
               exp->repeat[(int)((uint)uVar1 + (uint)(ushort)orig_pos)],(ulong)set2.ctx_size._3_1_);
      }
    }
    uVar3 = set_snode_new_in_ctx(set);
    for (orig_pos._2_2_ = 0; (uint)orig_pos._2_2_ < set->used; orig_pos._2_2_ = orig_pos._2_2_ + 1)
    {
      if ((set->val).nodes[orig_pos._2_2_].pos == uVar3) {
        (set->val).nodes[orig_pos._2_2_].pos = 1;
        *exp_idx = uVar1;
        for (orig_pos._0_2_ = 0;
            (int)(uint)(ushort)orig_pos < (int)((uint)(ushort)orig_size - (uint)uVar1);
            orig_pos._0_2_ = (ushort)orig_pos + 1) {
          if (*(long *)((long)pvVar7 + (ulong)(ushort)orig_pos * 8) != 0) {
            for (set2.ctx_size._3_1_ = 0;
                *(char *)(*(long *)((long)pvVar7 + (ulong)(ushort)orig_pos * 8) +
                         (ulong)set2.ctx_size._3_1_) != '\0';
                set2.ctx_size._3_1_ = set2.ctx_size._3_1_ + 1) {
            }
            set2.ctx_size._3_1_ = set2.ctx_size._3_1_ + 1;
            memcpy(exp->repeat[(int)((uint)uVar1 + (uint)(ushort)orig_pos)],
                   *(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8),(ulong)set2.ctx_size._3_1_
                  );
          }
        }
        iVar2 = eval_expr(exp,exp_idx,cur_node,param_4,set,options);
        if (iVar2 != 0) {
          for (orig_pos._0_2_ = 0;
              (int)(uint)(ushort)orig_pos < (int)((uint)(ushort)orig_size - (uint)uVar1);
              orig_pos._0_2_ = (ushort)orig_pos + 1) {
            free(*(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8));
          }
          free(pvVar7);
          return iVar2;
        }
        (set->val).nodes[orig_pos._2_2_].pos = uVar3;
      }
    }
    for (orig_pos._2_2_ = 0; (uint)orig_pos._2_2_ < set->used; orig_pos._2_2_ = orig_pos._2_2_ + 1)
    {
      if ((set->val).nodes[orig_pos._2_2_].pos == 1) {
        (set->val).nodes[orig_pos._2_2_].pos = 0;
      }
      else if ((set->val).nodes[orig_pos._2_2_].pos == uVar3) {
        (set->val).nodes[orig_pos._2_2_].pos = 1;
      }
    }
    for (orig_pos._0_2_ = 0;
        (int)(uint)(ushort)orig_pos < (int)((uint)(ushort)orig_size - (uint)uVar1);
        orig_pos._0_2_ = (ushort)orig_pos + 1) {
      free(*(void **)((long)pvVar7 + (ulong)(ushort)orig_pos * 8));
    }
    free(pvVar7);
  }
  else {
    local_98._0_4_ = LYXP_SET_EMPTY;
    set_fill_set((lyxp_set *)local_98,set);
    iVar2 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)local_98,options);
    if (iVar2 != 0) {
      lyxp_set_cast((lyxp_set *)local_98,LYXP_SET_EMPTY,cur_node,param_4,options);
      return iVar2;
    }
    lyxp_set_cast((lyxp_set *)local_98,LYXP_SET_BOOLEAN,cur_node,param_4,options);
    if (set2._8_4_ == 0) {
      lyxp_set_cast(set,LYXP_SET_EMPTY,cur_node,param_4,options);
    }
    lyxp_set_cast((lyxp_set *)local_98,LYXP_SET_EMPTY,cur_node,param_4,options);
  }
  if ('\x02' < ly_log_level) {
    pcVar4 = "skipped";
    if (set != (lyxp_set *)0x0) {
      pcVar4 = "parsed";
    }
    pcVar5 = print_token(exp->tokens[*exp_idx]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_predicate",pcVar4,pcVar5,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  *exp_idx = *exp_idx + 1;
  return 0;
}

Assistant:

static int
eval_predicate(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
               struct lyxp_set *set, int options)
{
    int ret;
    uint16_t i, j, orig_exp, brack2_exp;
    uint32_t orig_pos, orig_size, pred_in_ctx;
    uint8_t **pred_repeat, rep_size;
    struct lyxp_set set2;

    /* '[' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
           print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    if (!set) {
        ret = eval_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
        if (ret) {
            return ret;
        }
    } else if (set->type == LYXP_SET_NODE_SET) {
#ifndef NDEBUG
        /* we (possibly) need the set sorted, it can affect the result (if the predicate result is a number) */
        if (set_sort(set, cur_node, options) > 1) {
            LOGERR(LY_EINT, "XPath set was expected to be sorted, but is not (%s).", __func__);
        }
#endif

        orig_exp = *exp_idx;

        /* find the predicate end */
        for (brack2_exp = orig_exp; exp->tokens[brack2_exp] != LYXP_TOKEN_BRACK2; ++brack2_exp);

        /* copy predicate repeats, since they get deleted each time (probably not an ideal solution) */
        pred_repeat = calloc(brack2_exp - orig_exp, sizeof *pred_repeat);
        if (!pred_repeat) {
            LOGMEM;
            return -1;
        }
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            if (exp->repeat[orig_exp + j]) {
                for (rep_size = 0; exp->repeat[orig_exp + j][rep_size]; ++rep_size);
                ++rep_size;
                pred_repeat[j] = malloc(rep_size * sizeof **pred_repeat);
                if (!pred_repeat[j]) {
                    LOGMEM;
                    for (i = 0; i < j; ++i) {
                        free(pred_repeat[j]);
                    }
                    free(pred_repeat);
                    return -1;
                }
                memcpy(pred_repeat[j], exp->repeat[orig_exp + j], rep_size * sizeof **pred_repeat);
            }
        }

        orig_size = set->used;
        for (i = 0, orig_pos = 1; i < set->used; ++orig_pos) {
            set2.type = LYXP_SET_EMPTY;
            set_insert_node(&set2, set->val.nodes[i].node, set->val.nodes[i].pos, set->val.nodes[i].type, 0);
            /* remember the node context position for position() and context size for last() */
            set2.ctx_pos = orig_pos;
            set2.ctx_size = orig_size;
            *exp_idx = orig_exp;

            /* replace repeats */
            for (j = 0; j < brack2_exp - orig_exp; ++j) {
                if (pred_repeat[j]) {
                    for (rep_size = 0; pred_repeat[j][rep_size]; ++rep_size);
                    ++rep_size;
                    memcpy(exp->repeat[orig_exp + j], pred_repeat[j], rep_size * sizeof **pred_repeat);
                }
            }

            ret = eval_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
            if (ret) {
                for (j = 0; j < brack2_exp - orig_exp; ++j) {
                    free(pred_repeat[j]);
                }
                free(pred_repeat);
                lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
                return ret;
            }

            /* number is a position */
            if (set2.type == LYXP_SET_NUMBER) {
                if ((long long)set2.val.num == orig_pos) {
                    set2.val.num = 1;
                } else {
                    set2.val.num = 0;
                }
            }
            lyxp_set_cast(&set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);

            /* predicate satisfied or not? */
            if (set2.val.bool) {
                ++i;
            } else {
                set_remove_node(set, i);
            }
        }

        /* free predicate repeats */
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            free(pred_repeat[j]);
        }
        free(pred_repeat);

    } else if (set->type == LYXP_SET_SNODE_SET) {
        orig_exp = *exp_idx;

        /* find the predicate end */
        for (brack2_exp = orig_exp; exp->tokens[brack2_exp] != LYXP_TOKEN_BRACK2; ++brack2_exp);

        /* copy predicate repeats, since they get deleted each time (probably not an ideal solution) */
        pred_repeat = calloc(brack2_exp - orig_exp, sizeof *pred_repeat);
        if (!pred_repeat) {
            LOGMEM;
            return -1;
        }
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            if (exp->repeat[orig_exp + j]) {
                for (rep_size = 0; exp->repeat[orig_exp + j][rep_size]; ++rep_size);
                ++rep_size;
                pred_repeat[j] = malloc(rep_size * sizeof **pred_repeat);
                if (!pred_repeat[j]) {
                    LOGMEM;
                    for (i = 0; i < j; ++i) {
                        free(pred_repeat[j]);
                    }
                    free(pred_repeat);
                    return -1;
                }
                memcpy(pred_repeat[j], exp->repeat[orig_exp + j], rep_size * sizeof **pred_repeat);
            }
        }

        /* set special in_ctx to all the valid snodes */
        pred_in_ctx = set_snode_new_in_ctx(set);

        /* use the valid snodes one-by-one */
        for (i = 0; i < set->used; ++i) {
            if (set->val.snodes[i].in_ctx != pred_in_ctx) {
                continue;
            }
            set->val.snodes[i].in_ctx = 1;

            *exp_idx = orig_exp;

            /* replace repeats */
            for (j = 0; j < brack2_exp - orig_exp; ++j) {
                if (pred_repeat[j]) {
                    for (rep_size = 0; pred_repeat[j][rep_size]; ++rep_size);
                    ++rep_size;
                    memcpy(exp->repeat[orig_exp + j], pred_repeat[j], rep_size * sizeof **pred_repeat);
                }
            }

            ret = eval_expr(exp, exp_idx, cur_node, local_mod, set, options);
            if (ret) {
                for (j = 0; j < brack2_exp - orig_exp; ++j) {
                    free(pred_repeat[j]);
                }
                free(pred_repeat);
                return ret;
            }

            set->val.snodes[i].in_ctx = pred_in_ctx;
        }

        /* restore the state as it was before the predicate */
        for (i = 0; i < set->used; ++i) {
            if (set->val.snodes[i].in_ctx == 1) {
                set->val.snodes[i].in_ctx = 0;
            } else if (set->val.snodes[i].in_ctx == pred_in_ctx) {
                set->val.snodes[i].in_ctx = 1;
            }
        }

        /* free predicate repeats */
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            free(pred_repeat[j]);
        }
        free(pred_repeat);
    } else {
        set2.type = LYXP_SET_EMPTY;
        set_fill_set(&set2, set);

        ret = eval_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        lyxp_set_cast(&set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);
        if (!set2.val.bool) {
            lyxp_set_cast(set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        }
        lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
    }

    /* ']' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
           print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    return EXIT_SUCCESS;
}